

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O3

void __thiscall
QPDFArgParser::QPDFArgParser(QPDFArgParser *this,int argc,char **argv,char *progname_env)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  Members *this_00;
  OptionEntry *pOVar3;
  string local_d0;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_00 = (Members *)operator_new(0x290);
  Members::Members(this_00,argc,argv,progname_env);
  (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<QPDFArgParser::Members*>
            (&(this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00);
  peVar2 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2->option_table = &peVar2->help_option_table;
  std::__cxx11::string::_M_replace
            ((ulong)&peVar2->option_table_name,0,
             (char *)(peVar2->option_table_name)._M_string_length,0x26b541);
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"help","");
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x18);
  *(code **)local_50._M_unused._0_8_ = argHelp;
  *(undefined8 *)((long)local_50._M_unused._0_8_ + 8) = 0;
  *(QPDFArgParser **)((long)local_50._M_unused._0_8_ + 0x10) = this;
  local_38 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<std::_Mem_fn<void_(QPDFArgParser::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_(QPDFArgParser_*,_std::_Placeholder<1>)>_>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<std::_Mem_fn<void_(QPDFArgParser::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_(QPDFArgParser_*,_std::_Placeholder<1>)>_>
             ::_M_manager;
  addChoices(this,&local_d0,(param_arg_handler_t *)&local_50,false,
             &PTR_anon_var_dwarf_24d5e1_002eb250);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"help","");
  local_70._8_8_ = 0;
  local_70._M_unused._M_object = operator_new(0x18);
  *(code **)local_70._M_unused._0_8_ = invalidHelpArg;
  *(undefined8 *)((long)local_70._M_unused._0_8_ + 8) = 0;
  *(QPDFArgParser **)((long)local_70._M_unused._0_8_ + 0x10) = this;
  local_58 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<std::_Mem_fn<void_(QPDFArgParser::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_(QPDFArgParser_*,_std::_Placeholder<1>)>_>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<std::_Mem_fn<void_(QPDFArgParser::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_(QPDFArgParser_*,_std::_Placeholder<1>)>_>
             ::_M_manager;
  addInvalidChoiceHandler(this,&local_d0,(param_arg_handler_t *)&local_70);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"completion-bash","");
  local_90._8_8_ = 0;
  local_90._M_unused._M_object = operator_new(0x18);
  *(code **)local_90._M_unused._0_8_ = argCompletionBash;
  *(undefined8 *)((long)local_90._M_unused._0_8_ + 8) = 0;
  *(QPDFArgParser **)((long)local_90._M_unused._0_8_ + 0x10) = this;
  local_78 = std::
             _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_(QPDFArgParser::*)()>_(QPDFArgParser_*)>_>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_(QPDFArgParser::*)()>_(QPDFArgParser_*)>_>
             ::_M_manager;
  pOVar3 = registerArg(this,&local_d0);
  pOVar3->parameter_needed = false;
  std::function<void_()>::operator=(&pOVar3->bare_arg_handler,(function<void_()> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"completion-zsh","");
  local_b0._8_8_ = 0;
  local_b0._M_unused._M_object = operator_new(0x18);
  *(code **)local_b0._M_unused._0_8_ = argCompletionZsh;
  *(undefined8 *)((long)local_b0._M_unused._0_8_ + 8) = 0;
  *(QPDFArgParser **)((long)local_b0._M_unused._0_8_ + 0x10) = this;
  local_98 = std::
             _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_(QPDFArgParser::*)()>_(QPDFArgParser_*)>_>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_(QPDFArgParser::*)()>_(QPDFArgParser_*)>_>
             ::_M_manager;
  pOVar3 = registerArg(this,&local_d0);
  pOVar3->parameter_needed = false;
  std::function<void_()>::operator=(&pOVar3->bare_arg_handler,(function<void_()> *)&local_b0);
  if (local_a0 != (code *)0x0) {
    (*local_a0)(&local_b0,&local_b0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  peVar2 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2->option_table = &peVar2->main_option_table;
  std::__cxx11::string::_M_replace
            ((ulong)&peVar2->option_table_name,0,
             (char *)(peVar2->option_table_name)._M_string_length,0x2614e8);
  return;
}

Assistant:

QPDFArgParser::QPDFArgParser(int argc, char const* const argv[], char const* progname_env) :
    m(new Members(argc, argv, progname_env))
{
    selectHelpOptionTable();
    char const* help_choices[] = {"all", nullptr};
    // More help choices are added dynamically.
    addChoices("help", bindParam(&QPDFArgParser::argHelp, this), false, help_choices);
    addInvalidChoiceHandler("help", bindParam(&QPDFArgParser::invalidHelpArg, this));
    addBare("completion-bash", bindBare(&QPDFArgParser::argCompletionBash, this));
    addBare("completion-zsh", bindBare(&QPDFArgParser::argCompletionZsh, this));
    selectMainOptionTable();
}